

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ed.c
# Opt level: O2

void ed_sub(ed *out,ed *P,ed *Q)

{
  fld_t b;
  fld_t a;
  fld_t e;
  fld_t t;
  fld_t h;
  fld_t g;
  fld_t f;
  fld_t d;
  fld_t c;
  limb_t alStack_1d8 [6];
  limb_t local_1a8 [6];
  limb_t local_178 [6];
  limb_t local_148 [6];
  limb_t local_118 [6];
  limb_t local_e8 [6];
  limb_t local_b8 [6];
  limb_t local_88 [6];
  limb_t local_58 [5];
  
  fld_sub(local_1a8,P->y,P->x);
  fld_add(local_148,Q->y,Q->x);
  fld_mul(local_1a8,local_1a8,local_148);
  fld_add(alStack_1d8,P->y,P->x);
  fld_sub(local_148,Q->y,Q->x);
  fld_mul(alStack_1d8,alStack_1d8,local_148);
  fld_mul(local_58,P->t,Q->t);
  fld_mul(local_58,local_58,con_m2d);
  fld_mul(local_88,P->z,Q->z);
  fld_scale2(local_88,local_88);
  fld_sub(local_178,alStack_1d8,local_1a8);
  fld_sub(local_b8,local_88,local_58);
  fld_add(local_e8,local_88,local_58);
  fld_add(local_118,alStack_1d8,local_1a8);
  fld_mul(out->x,local_178,local_b8);
  fld_mul(out->y,local_e8,local_118);
  fld_mul(out->t,local_178,local_118);
  fld_mul(out->z,local_b8,local_e8);
  return;
}

Assistant:

static void
ed_sub(struct ed *out, const struct ed *P, const struct ed *Q)
{
	fld_t a, b, c, d, e, f, g, h, t;
	
	fld_sub(a, P->y, P->x);
	fld_add(t, Q->y, Q->x);
	fld_mul(a, a, t);

	fld_add(b, P->y, P->x);
	fld_sub(t, Q->y, Q->x);
	fld_mul(b, b, t);

	fld_mul(c, P->t, Q->t);
	fld_mul(c, c, con_m2d);

	fld_mul(d, P->z, Q->z);
	fld_scale2(d, d);

	fld_sub(e, b, a);
	fld_sub(f, d, c);
	fld_add(g, d, c);
	fld_add(h, b, a);
	
	fld_mul(out->x, e, f);
	fld_mul(out->y, g, h);
	fld_mul(out->t, e, h);
	fld_mul(out->z, f, g);
}